

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

upb_DecodeStatus
upb_DecodeLengthPrefixed
          (char *buf,size_t size,upb_Message *msg,size_t *num_bytes_read,upb_MiniTable *mt,
          upb_ExtensionRegistry *extreg,int options,upb_Arena *arena)

{
  long lVar1;
  upb_DecodeStatus uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong size_00;
  long lVar6;
  bool bVar7;
  
  if (size == 0) {
    size_00 = 0;
    bVar7 = false;
  }
  else {
    uVar5 = 9;
    if (size - 1 < 9) {
      uVar5 = size - 1;
    }
    lVar3 = 0;
    size_00 = 0;
    lVar1 = 1;
    do {
      lVar6 = lVar1;
      size_00 = ((ulong)((byte)buf[lVar6 + -1] & 0x7f) << ((byte)lVar3 & 0x3f)) + size_00;
      if (-1 < buf[lVar6 + -1]) {
        *num_bytes_read = lVar6 + size_00;
        iVar4 = 2;
        goto LAB_0011ffdc;
      }
      lVar3 = lVar3 + 7;
      lVar1 = lVar6 + 1;
    } while (uVar5 * 7 + 7 != lVar3);
    iVar4 = 1;
LAB_0011ffdc:
    bVar7 = iVar4 == 2;
    buf = buf + lVar6;
  }
  if (((bVar7) && (*num_bytes_read <= size)) && (size_00 < 0x80000000)) {
    uVar2 = upb_Decode(buf,size_00,msg,mt,extreg,options,arena);
  }
  else {
    uVar2 = kUpb_DecodeStatus_Malformed;
  }
  return uVar2;
}

Assistant:

upb_DecodeStatus upb_DecodeLengthPrefixed(const char* buf, size_t size,
                                          upb_Message* msg,
                                          size_t* num_bytes_read,
                                          const upb_MiniTable* mt,
                                          const upb_ExtensionRegistry* extreg,
                                          int options, upb_Arena* arena) {
  // To avoid needing to make a Decoder just to decode the initial length,
  // hand-decode the leading varint for the message length here.
  uint64_t msg_len = 0;
  for (size_t i = 0;; ++i) {
    if (i >= size || i > 9) {
      return kUpb_DecodeStatus_Malformed;
    }
    uint64_t b = *buf;
    buf++;
    msg_len += (b & 0x7f) << (i * 7);
    if ((b & 0x80) == 0) {
      *num_bytes_read = i + 1 + msg_len;
      break;
    }
  }

  // If the total number of bytes we would read (= the bytes from the varint
  // plus however many bytes that varint says we should read) is larger then the
  // input buffer then error as malformed.
  if (*num_bytes_read > size) {
    return kUpb_DecodeStatus_Malformed;
  }
  if (msg_len > INT32_MAX) {
    return kUpb_DecodeStatus_Malformed;
  }

  return upb_Decode(buf, msg_len, msg, mt, extreg, options, arena);
}